

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O2

int exe_fuses_and_daemons
              (voccxdef *ctx,int err,int do_fuses,objnum actor,objnum verb,vocoldef *dobj_list,
              int dobj_cnt,objnum prep,objnum iobj)

{
  errdef fr_;
  
  if (do_fuses != 0) {
    fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
    if (fr_.errcode == 0) {
      fr_.errprv = ctx->voccxerr->errcxptr;
      ctx->voccxerr->errcxptr = &fr_;
      exedaem(ctx);
      exefuse(ctx,1);
      ctx->voccxerr->errcxptr = fr_.errprv;
    }
    else {
      ctx->voccxerr->errcxptr = fr_.errprv;
      err = 0x3f6;
      if (fr_.errcode != 0x3f6) {
        errrse1(ctx->voccxerr,&fr_);
      }
    }
  }
  if (ctx->voccxendcmd != 0xffff) {
    runpnum(ctx->voccxrun,(long)err);
    runpobj(ctx->voccxrun,iobj);
    runpobj(ctx->voccxrun,prep);
    voc_push_vocoldef_list(ctx,dobj_list,dobj_cnt);
    runpobj(ctx->voccxrun,verb);
    runpobj(ctx->voccxrun,actor);
    runfn(ctx->voccxrun,ctx->voccxendcmd,6);
  }
  return err;
}

Assistant:

int exe_fuses_and_daemons(voccxdef *ctx, int err, int do_fuses,
                          objnum actor, objnum verb,
                          vocoldef *dobj_list, int dobj_cnt,
                          objnum prep, objnum iobj)
{
    int err2;

    /* presume no error */
    err2 = 0;
    
    /* execute fuses and daemons if desired - trap any errors that occur */
    if (do_fuses)
    {
        ERRBEGIN(ctx->voccxerr)
        {
            /* execute daemons */
            exedaem(ctx);
            
            /* execute fuses */
            (void)exefuse(ctx, TRUE);
        }
        ERRCATCH(ctx->voccxerr, err2)
        {
            /* 
             *   if 'abort' was invoked, ignore it, since it's now had the
             *   desired effect of skipping any remaining fuses and
             *   daemons; resignal any other error 
             */
            if (err2 != ERR_RUNABRT)
                errrse(ctx->voccxerr);
            
            /* replace any previous error with the new error code */
            err = err2;
        }
        ERREND(ctx->voccxerr);
    }

    /* execute endCommand if it's defined */
    if (ctx->voccxendcmd != MCMONINV)
    {
        /* push the arguments */
        runpnum(ctx->voccxrun, err);
        runpobj(ctx->voccxrun, iobj);
        runpobj(ctx->voccxrun, prep);
        voc_push_vocoldef_list(ctx, dobj_list, dobj_cnt);
        runpobj(ctx->voccxrun, verb);
        runpobj(ctx->voccxrun, actor);

        /* call endCommand */
        runfn(ctx->voccxrun, ctx->voccxendcmd, 6);
    }

    /* return the error status */
    return err;
}